

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdl_interface.c
# Opt level: O3

_Bool init_SDL(void)

{
  int iVar1;
  SDL_Renderer *pSVar2;
  undefined8 uVar3;
  char *__format;
  
  iVar1 = SDL_Init(0xf231);
  if (iVar1 < 0) {
    __format = "ERROR: SDL failed to init: %s\n";
  }
  else {
    screen = (SDL_Window *)
             SDL_CreateWindow("NES EMU by Fisherman166",0x1fff0000,0x1fff0000,0x280,0x1e0,2);
    if (screen == (SDL_Window *)0x0) {
      __format = "ERROR: Failed to create SDL WINDOW %s\n";
    }
    else {
      pSVar2 = (SDL_Renderer *)SDL_CreateRenderer(screen,0xffffffff,2);
      renderer = pSVar2;
      if (pSVar2 == (SDL_Renderer *)0x0) {
        __format = "ERROR: %s\n";
      }
      else {
        iVar1 = SDL_SetRenderDrawColor(pSVar2,0,0,0,0xff);
        __format = "ERROR: Renderer: %s\n";
        if ((iVar1 == 0) && (iVar1 = SDL_RenderClear(pSVar2), iVar1 == 0)) {
          SDL_RenderPresent(pSVar2);
          iVar1 = SDL_SetHint("SDL_RENDER_SCALE_QUALITY","linear");
          if (iVar1 == 0) {
            __format = "ERROR: HINT: %s\n";
          }
          else {
            iVar1 = SDL_RenderSetLogicalSize(renderer,0x100,0xf0);
            if (iVar1 == 0) {
              texture = (SDL_Texture *)SDL_CreateTexture(renderer,0x16362004,1,0x100,0xf0);
              if (texture != (SDL_Texture *)0x0) {
                return false;
              }
              __format = "ERROR: Texture creation: %s\n";
              texture = (SDL_Texture *)0x0;
            }
            else {
              __format = "ERROR: Set Logical Size: %s\n";
            }
          }
        }
      }
    }
  }
  uVar3 = SDL_GetError();
  printf(__format,uVar3);
  return true;
}

Assistant:

bool init_SDL() {
    if( SDL_Init(SDL_INIT_EVERYTHING) < 0 ) {
        printf("ERROR: SDL failed to init: %s\n", SDL_GetError());
        return true;
    }

    screen = SDL_CreateWindow("NES EMU by Fisherman166",
                              SDL_WINDOWPOS_UNDEFINED,
                              SDL_WINDOWPOS_UNDEFINED,
                              640, 480,
                              SDL_WINDOW_OPENGL);
    if(screen == NULL) {
        printf("ERROR: Failed to create SDL WINDOW %s\n", SDL_GetError());
        return true;
    }

    // Renderer stuff
    renderer = SDL_CreateRenderer(screen, -1, SDL_RENDERER_ACCELERATED);
    if(renderer == NULL) {
        printf("ERROR: %s\n", SDL_GetError());
        return true;
    }
    if(clear_renderer(renderer)) return true;

    if(SDL_SetHint(SDL_HINT_RENDER_SCALE_QUALITY, "linear") == SDL_FALSE) {
        printf("ERROR: HINT: %s\n", SDL_GetError());
        return true;
    }
    if(SDL_RenderSetLogicalSize(renderer, SCREEN_WIDTH, SCREEN_HEIGHT)) {
        printf("ERROR: Set Logical Size: %s\n", SDL_GetError());
        return true;
    }

    texture = SDL_CreateTexture(
        renderer,
        SDL_PIXELFORMAT_ARGB8888,
        SDL_TEXTUREACCESS_STREAMING,
        SCREEN_WIDTH, SCREEN_HEIGHT);
    if(texture == NULL) {
        printf("ERROR: Texture creation: %s\n", SDL_GetError());
        return true;
    }

    return false;
}